

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_cb_hdr.c
# Opt level: O0

size_t tool_header_cb(char *ptr,size_t size,size_t nmemb,void *userdata)

{
  OutStruct *pOVar1;
  long lVar2;
  _Bool _Var3;
  int iVar4;
  char *pcVar5;
  char *pcVar6;
  void *pvVar7;
  ulong uVar8;
  bool bVar9;
  size_t namelen;
  char *value_1;
  char *value;
  curl_slist *old;
  char *clone;
  size_t len;
  char *filename;
  char *p;
  size_t etag_length;
  char *eot;
  char *etag_h;
  long response;
  size_t rc;
  char *scheme;
  char *end;
  size_t cb;
  char *str;
  OutStruct *etag_save;
  OutStruct *heads;
  OutStruct *outs;
  HdrCbData *hdrcbdata;
  per_transfer *per;
  void *userdata_local;
  size_t nmemb_local;
  size_t size_local;
  char *ptr_local;
  
  outs = (OutStruct *)((long)userdata + 0x148);
  heads = (OutStruct *)((long)userdata + 0xd0);
  etag_save = (OutStruct *)((long)userdata + 0xf8);
  str = (char *)((long)userdata + 0x120);
  end = (char *)(size * nmemb);
  scheme = ptr + (long)end;
  rc = 0;
  if (*(long *)((long)userdata + 0x10) == 0) {
    return 0xffffffff;
  }
  cb = (size_t)ptr;
  hdrcbdata = (HdrCbData *)userdata;
  per = (per_transfer *)userdata;
  userdata_local = (void *)nmemb;
  nmemb_local = size;
  size_local = (size_t)ptr;
  if ((*(long *)(*(long *)((long)userdata + 0x10) + 0xe0) != 0) &&
     (*(long *)((long)userdata + 0x108) != 0)) {
    response = fwrite(ptr,size,nmemb,*(FILE **)((long)userdata + 0x108));
    if ((char *)response != end) {
      return (size_t)(char *)response;
    }
    iVar4 = fflush((FILE *)etag_save->stream);
    if (iVar4 != 0) {
      errorf((GlobalConfig *)hdrcbdata->outs[0x21].filename,"Failed writing headers to %s",
             hdrcbdata->outs[5].bytes);
      return 0xffffffff;
    }
  }
  curl_easy_getinfo(hdrcbdata->etag_save,0x100031,&rc);
  rc = (size_t)proto_token((char *)rc);
  if (((char *)rc == proto_http) || ((char *)rc == proto_https)) {
    etag_h = (char *)0x0;
    curl_easy_getinfo(hdrcbdata->etag_save,0x200002,&etag_h);
    if (((long)etag_h / 100 == 2) || ((long)etag_h / 100 == 3)) {
      pOVar1 = hdrcbdata->outs;
      lVar2._0_1_ = pOVar1[0x13].alloc_filename;
      lVar2._1_1_ = pOVar1[0x13].is_cd_filename;
      lVar2._2_1_ = pOVar1[0x13].s_isreg;
      lVar2._3_1_ = pOVar1[0x13].fopened;
      lVar2._4_4_ = *(undefined4 *)&pOVar1[0x13].field_0xc;
      if (((lVar2 == 0) || (*(long *)(str + 0x10) == 0)) ||
         (iVar4 = curl_strnequal(cb,"etag:",5), iVar4 == 0)) {
        if ((outs[1].alloc_filename & 1U) != 0) {
          if (((char *)0x14 < end) &&
             (iVar4 = curl_strnequal(cb,"Content-disposition:",0x14), iVar4 != 0)) {
            filename = (char *)(cb + 0x14);
            while( true ) {
              while( true ) {
                bVar9 = false;
                if ((filename < scheme) && (bVar9 = false, *filename != '\0')) {
                  if (((*filename < 'a') || (bVar9 = true, 'z' < *filename)) &&
                     (bVar9 = false, '@' < *filename)) {
                    bVar9 = *filename < '[';
                  }
                  bVar9 = (bool)(bVar9 ^ 1);
                }
                if (!bVar9) break;
                filename = filename + 1;
              }
              if (scheme + -9 < filename) goto LAB_0010bcee;
              iVar4 = memcmp(filename,"filename=",9);
              if (iVar4 == 0) break;
              while( true ) {
                bVar9 = false;
                if ((filename < scheme) && (bVar9 = false, *filename != '\0')) {
                  bVar9 = *filename != ';';
                }
                if (!bVar9) break;
                filename = filename + 1;
              }
              if ((scheme <= filename) || (*filename == '\0')) goto LAB_0010bcee;
            }
            pcVar5 = parse_filename(filename + 9,(long)end - ((long)(filename + 9) - cb));
            if (pcVar5 != (char *)0x0) {
              if (heads->stream != (FILE *)0x0) {
                free(pcVar5);
                return 0xffffffff;
              }
              if (hdrcbdata->outs[5].stream == (FILE *)0x0) {
                heads->filename = pcVar5;
              }
              else {
                pcVar6 = (char *)curl_maprintf("%s/%s",hdrcbdata->outs[5].stream,pcVar5);
                heads->filename = pcVar6;
                free(pcVar5);
                if (heads->filename == (char *)0x0) {
                  return 0xffffffff;
                }
              }
              heads->is_cd_filename = true;
              heads->s_isreg = true;
              heads->fopened = false;
              heads->alloc_filename = true;
              outs[1].alloc_filename = false;
              _Var3 = tool_create_output_file(heads,(OperationConfig *)hdrcbdata->outs);
              if (!_Var3) {
                return 0xffffffff;
              }
              iVar4 = tool_write_headers((HdrCbData *)&hdrcbdata[5].honor_cd_filename,heads->stream)
              ;
              if (iVar4 != 0) {
                return 0xffffffff;
              }
            }
LAB_0010bcee:
            if ((heads->stream == (FILE *)0x0) &&
               (_Var3 = tool_create_output_file(heads,(OperationConfig *)hdrcbdata->outs), !_Var3))
            {
              return 0xffffffff;
            }
            iVar4 = tool_write_headers((HdrCbData *)&hdrcbdata[5].honor_cd_filename,heads->stream);
            if (iVar4 != 0) {
              return 0xffffffff;
            }
          }
          if (((outs[1].alloc_filename & 1U) != 0) &&
             ((*(byte *)(*(long *)&outs->alloc_filename + 0x1e7) & 1) != 0)) {
            pvVar7 = (void *)curl_maprintf("%.*s",(ulong)end & 0xffffffff,cb);
            if (pvVar7 == (void *)0x0) {
              curl_slist_free_all(outs[1].filename);
              outs[1].filename = (char *)0x0;
              return 0xffffffff;
            }
            pcVar5 = outs[1].filename;
            pcVar6 = (char *)curl_slist_append(pcVar5,pvVar7);
            outs[1].filename = pcVar6;
            free(pvVar7);
            if (outs[1].filename == (char *)0x0) {
              curl_slist_free_all(pcVar5);
              return 0xffffffff;
            }
            return (size_t)end;
          }
        }
      }
      else {
        eot = (char *)(cb + 5);
        etag_length = (size_t)(scheme + -1);
        if (*(char *)etag_length == '\n') {
          while( true ) {
            if ((*eot == ' ') || (bVar9 = false, *eot == '\t')) {
              bVar9 = eot < etag_length;
            }
            if (!bVar9) break;
            eot = eot + 1;
          }
          while( true ) {
            bVar9 = true;
            if (((*(char *)etag_length != ' ') && (bVar9 = true, *(char *)etag_length != '\t')) &&
               (bVar9 = false, '\t' < *(char *)etag_length)) {
              bVar9 = *(char *)etag_length < '\x0e';
            }
            if (!bVar9) break;
            etag_length = etag_length - 1;
          }
          if (eot <= etag_length) {
            iVar4 = fileno(*(FILE **)(str + 0x10));
            iVar4 = ftruncate64(iVar4,0);
            if (iVar4 != 0) {
              return 0xffffffff;
            }
            fwrite(eot,nmemb_local,(etag_length - (long)eot) + 1,*(FILE **)(str + 0x10));
            fputc(10,*(FILE **)(str + 0x10));
            fflush(*(FILE **)(str + 0x10));
          }
        }
      }
    }
  }
  if (*(long *)(*(long *)&outs->alloc_filename + 0x358) != 0) {
    pvVar7 = memchr((void *)size_local,0x3a,(size_t)end);
    if (pvVar7 == (void *)0x0) {
      if ((*(char *)size_local == '\r') || (*(char *)size_local == '\n')) {
        *(undefined1 *)((long)&hdrcbdata[8].heads + 2) = 1;
      }
    }
    else {
      if (((ulong)hdrcbdata[8].heads & 0x10000) != 0) {
        *(undefined8 *)&hdrcbdata[6].honor_cd_filename = 0;
      }
      *(undefined1 *)((long)&hdrcbdata[8].heads + 2) = 0;
      *(long *)&hdrcbdata[6].honor_cd_filename = *(long *)&hdrcbdata[6].honor_cd_filename + 1;
    }
  }
  if (((*(byte *)(*(long *)&outs->alloc_filename + 0x1e7) & 1) != 0) &&
     ((((char *)rc == proto_http || ((char *)rc == proto_https)) ||
      (((char *)rc == proto_rtsp || ((char *)rc == proto_file)))))) {
    namelen = 0;
    if ((heads->stream == (FILE *)0x0) &&
       (_Var3 = tool_create_output_file(heads,(OperationConfig *)hdrcbdata->outs), !_Var3)) {
      return 0xffffffff;
    }
    if (((outs->filename[3] & 1U) != 0) && ((outs->filename[0x31] & 1U) != 0)) {
      namelen = (size_t)memchr((void *)size_local,0x3a,(size_t)end);
    }
    if (namelen == 0) {
      fwrite((void *)size_local,(size_t)end,1,(FILE *)heads->stream);
    }
    else {
      uVar8 = namelen - size_local;
      curl_mfprintf(heads->stream,"\x1b[1m%.*s\x1b[0m:",uVar8 & 0xffffffff,size_local);
      iVar4 = curl_strnequal("Location",size_local,uVar8);
      if (iVar4 == 0) {
        fwrite((void *)(namelen + 1),(size_t)(end + (-1 - uVar8)),1,(FILE *)heads->stream);
      }
      else {
        write_linked_location
                  ((CURL *)hdrcbdata->etag_save,(char *)(namelen + 1),(size_t)(end + (-1 - uVar8)),
                   heads->stream);
      }
    }
  }
  return (size_t)end;
}

Assistant:

size_t tool_header_cb(char *ptr, size_t size, size_t nmemb, void *userdata)
{
  struct per_transfer *per = userdata;
  struct HdrCbData *hdrcbdata = &per->hdrcbdata;
  struct OutStruct *outs = &per->outs;
  struct OutStruct *heads = &per->heads;
  struct OutStruct *etag_save = &per->etag_save;
  const char *str = ptr;
  const size_t cb = size * nmemb;
  const char *end = (char *)ptr + cb;
  const char *scheme = NULL;

  if(!per->config)
    return CURL_WRITEFUNC_ERROR;

#ifdef DEBUGBUILD
  if(size * nmemb > (size_t)CURL_MAX_HTTP_HEADER) {
    warnf(per->config->global, "Header data exceeds single call write limit");
    return CURL_WRITEFUNC_ERROR;
  }
#endif

#ifdef _WIN32
  /* Discard incomplete UTF-8 sequence buffered from body */
  if(outs->utf8seq[0])
    memset(outs->utf8seq, 0, sizeof(outs->utf8seq));
#endif

  /*
   * Write header data when curl option --dump-header (-D) is given.
   */

  if(per->config->headerfile && heads->stream) {
    size_t rc = fwrite(ptr, size, nmemb, heads->stream);
    if(rc != cb)
      return rc;
    /* flush the stream to send off what we got earlier */
    if(fflush(heads->stream)) {
      errorf(per->config->global, "Failed writing headers to %s",
             per->config->headerfile);
      return CURL_WRITEFUNC_ERROR;
    }
  }

  curl_easy_getinfo(per->curl, CURLINFO_SCHEME, &scheme);
  scheme = proto_token(scheme);
  if((scheme == proto_http || scheme == proto_https)) {
    long response = 0;
    curl_easy_getinfo(per->curl, CURLINFO_RESPONSE_CODE, &response);

    if((response/100 != 2) && (response/100 != 3))
      /* only care about etag and content-disposition headers in 2xx and 3xx
         responses */
      ;
    /*
     * Write etag to file when --etag-save option is given.
     */
    else if(per->config->etag_save_file && etag_save->stream &&
            /* match only header that start with etag (case insensitive) */
            checkprefix("etag:", str)) {
      const char *etag_h = &str[5];
      const char *eot = end - 1;
      if(*eot == '\n') {
        while(ISBLANK(*etag_h) && (etag_h < eot))
          etag_h++;
        while(ISSPACE(*eot))
          eot--;

        if(eot >= etag_h) {
          size_t etag_length = eot - etag_h + 1;
          /*
           * Truncate the etag save stream, it can have an existing etag value.
           */
#ifdef HAVE_FTRUNCATE
          if(ftruncate(fileno(etag_save->stream), 0)) {
            return CURL_WRITEFUNC_ERROR;
          }
#else
          if(fseek(etag_save->stream, 0, SEEK_SET)) {
            return CURL_WRITEFUNC_ERROR;
          }
#endif

          fwrite(etag_h, size, etag_length, etag_save->stream);
          /* terminate with newline */
          fputc('\n', etag_save->stream);
          (void)fflush(etag_save->stream);
        }
      }
    }

    /*
     * This callback sets the filename where output shall be written when
     * curl options --remote-name (-O) and --remote-header-name (-J) have
     * been simultaneously given and additionally server returns an HTTP
     * Content-Disposition header specifying a filename property.
     */

    else if(hdrcbdata->honor_cd_filename) {
      if((cb > 20) && checkprefix("Content-disposition:", str)) {
        const char *p = str + 20;

        /* look for the 'filename=' parameter
           (encoded filenames (*=) are not supported) */
        for(;;) {
          char *filename;
          size_t len;

          while((p < end) && *p && !ISALPHA(*p))
            p++;
          if(p > end - 9)
            break;

          if(memcmp(p, "filename=", 9)) {
            /* no match, find next parameter */
            while((p < end) && *p && (*p != ';'))
              p++;
            if((p < end) && *p)
              continue;
            else
              break;
          }
          p += 9;

          len = cb - (size_t)(p - str);
          filename = parse_filename(p, len);
          if(filename) {
            if(outs->stream) {
              /* indication of problem, get out! */
              free(filename);
              return CURL_WRITEFUNC_ERROR;
            }

            if(per->config->output_dir) {
              outs->filename = aprintf("%s/%s", per->config->output_dir,
                                       filename);
              free(filename);
              if(!outs->filename)
                return CURL_WRITEFUNC_ERROR;
            }
            else
              outs->filename = filename;

            outs->is_cd_filename = TRUE;
            outs->s_isreg = TRUE;
            outs->fopened = FALSE;
            outs->alloc_filename = TRUE;
            hdrcbdata->honor_cd_filename = FALSE; /* done now! */
            if(!tool_create_output_file(outs, per->config))
              return CURL_WRITEFUNC_ERROR;
            if(tool_write_headers(&per->hdrcbdata, outs->stream))
              return CURL_WRITEFUNC_ERROR;
          }
          break;
        }
        if(!outs->stream && !tool_create_output_file(outs, per->config))
          return CURL_WRITEFUNC_ERROR;
        if(tool_write_headers(&per->hdrcbdata, outs->stream))
          return CURL_WRITEFUNC_ERROR;
      } /* content-disposition handling */

      if(hdrcbdata->honor_cd_filename &&
         hdrcbdata->config->show_headers) {
        /* still awaiting the Content-Disposition header, store the header in
           memory. Since it is not zero terminated, we need an extra dance. */
        char *clone = aprintf("%.*s", (int)cb, (char *)str);
        if(clone) {
          struct curl_slist *old = hdrcbdata->headlist;
          hdrcbdata->headlist = curl_slist_append(old, clone);
          free(clone);
          if(!hdrcbdata->headlist) {
            curl_slist_free_all(old);
            return CURL_WRITEFUNC_ERROR;
          }
        }
        else {
          curl_slist_free_all(hdrcbdata->headlist);
          hdrcbdata->headlist = NULL;
          return CURL_WRITEFUNC_ERROR;
        }
        return cb; /* done for now */
      }
    }
  }
  if(hdrcbdata->config->writeout) {
    char *value = memchr(ptr, ':', cb);
    if(value) {
      if(per->was_last_header_empty)
        per->num_headers = 0;
      per->was_last_header_empty = FALSE;
      per->num_headers++;
    }
    else if(ptr[0] == '\r' || ptr[0] == '\n')
      per->was_last_header_empty = TRUE;
  }
  if(hdrcbdata->config->show_headers &&
    (scheme == proto_http || scheme == proto_https ||
     scheme == proto_rtsp || scheme == proto_file)) {
    /* bold headers only for selected protocols */
    char *value = NULL;

    if(!outs->stream && !tool_create_output_file(outs, per->config))
      return CURL_WRITEFUNC_ERROR;

    if(hdrcbdata->global->isatty &&
#ifdef _WIN32
       tool_term_has_bold &&
#endif
       hdrcbdata->global->styled_output)
      value = memchr(ptr, ':', cb);
    if(value) {
      size_t namelen = value - ptr;
      fprintf(outs->stream, BOLD "%.*s" BOLDOFF ":", (int)namelen, ptr);
#ifndef LINK
      fwrite(&value[1], cb - namelen - 1, 1, outs->stream);
#else
      if(curl_strnequal("Location", ptr, namelen)) {
        write_linked_location(per->curl, &value[1], cb - namelen - 1,
            outs->stream);
      }
      else
        fwrite(&value[1], cb - namelen - 1, 1, outs->stream);
#endif
    }
    else
      /* not "handled", just show it */
      fwrite(ptr, cb, 1, outs->stream);
  }
  return cb;
}